

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void groupConcatInverse(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  sqlite3_value *psVar2;
  int *__dest;
  uint uVar5;
  int iVar3;
  void *pvVar4;
  
  psVar2 = *argv;
  uVar5._0_2_ = psVar2->flags;
  uVar5._2_1_ = psVar2->enc;
  uVar5._3_1_ = psVar2->eSubtype;
  if (((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar5 & 0x3f) & 1) == 0) &&
     (pvVar4 = sqlite3_aggregate_context(context,0x30), pvVar4 != (void *)0x0)) {
    sqlite3_value_text(*argv);
    iVar3 = sqlite3_value_bytes(*argv);
    iVar1 = *(int *)((long)pvVar4 + 0x20);
    *(int *)((long)pvVar4 + 0x20) = iVar1 + -1;
    __dest = *(int **)((long)pvVar4 + 0x28);
    if (__dest == (int *)0x0) {
      iVar3 = iVar3 + *(int *)((long)pvVar4 + 0x24);
    }
    else if (1 < iVar1) {
      iVar3 = iVar3 + *__dest;
      memmove(__dest,__dest + 1,(ulong)(iVar1 - 2) << 2);
    }
    uVar5 = *(int *)((long)pvVar4 + 0x18) - iVar3;
    if (uVar5 == 0 || *(int *)((long)pvVar4 + 0x18) < iVar3) {
      *(undefined4 *)((long)pvVar4 + 0x18) = 0;
    }
    else {
      *(uint *)((long)pvVar4 + 0x18) = uVar5;
      memmove(*(void **)((long)pvVar4 + 8),
              (void *)((long)iVar3 + (long)*(void **)((long)pvVar4 + 8)),(ulong)uVar5);
      if (*(int *)((long)pvVar4 + 0x18) != 0) {
        return;
      }
    }
    *(undefined4 *)((long)pvVar4 + 0x14) = 0;
    sqlite3_free(*(void **)((long)pvVar4 + 0x28));
    *(undefined8 *)((long)pvVar4 + 0x28) = 0;
  }
  return;
}

Assistant:

static void groupConcatInverse(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GroupConcatCtx *pGCC;
  assert( argc==1 || argc==2 );
  (void)argc;  /* Suppress unused parameter warning */
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  pGCC = (GroupConcatCtx*)sqlite3_aggregate_context(context, sizeof(*pGCC));
  /* pGCC is always non-NULL since groupConcatStep() will have always
  ** run first to initialize it */
  if( ALWAYS(pGCC) ){
    int nVS;  /* Number of characters to remove */
    /* Must call sqlite3_value_text() to convert the argument into text prior
    ** to invoking sqlite3_value_bytes(), in case the text encoding is UTF16 */
    (void)sqlite3_value_text(argv[0]);
    nVS = sqlite3_value_bytes(argv[0]);
    pGCC->nAccum -= 1;
    if( pGCC->pnSepLengths!=0 ){
      assert(pGCC->nAccum >= 0);
      if( pGCC->nAccum>0 ){
        nVS += *pGCC->pnSepLengths;
        memmove(pGCC->pnSepLengths, pGCC->pnSepLengths+1,
               (pGCC->nAccum-1)*sizeof(int));
      }
    }else{
      /* If removing single accumulated string, harmlessly over-do. */
      nVS += pGCC->nFirstSepLength;
    }
    if( nVS>=(int)pGCC->str.nChar ){
      pGCC->str.nChar = 0;
    }else{
      pGCC->str.nChar -= nVS;
      memmove(pGCC->str.zText, &pGCC->str.zText[nVS], pGCC->str.nChar);
    }
    if( pGCC->str.nChar==0 ){
      pGCC->str.mxAlloc = 0;
      sqlite3_free(pGCC->pnSepLengths);
      pGCC->pnSepLengths = 0;
    }
  }
}